

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall cmXMLWriter::Attribute<cmsys::String>(cmXMLWriter *this,char *name,String *value)

{
  ostream *poVar1;
  String local_60;
  String local_40;
  String *local_20;
  String *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  local_20 = value;
  value_local = (String *)name;
  name_local = (char *)this;
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,(char *)value_local);
  poVar1 = std::operator<<(poVar1,"=\"");
  cmsys::String::String(&local_60,local_20);
  SafeAttribute<cmsys::String>(&local_40,&local_60);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::operator<<(poVar1,'\"');
  cmsys::String::~String(&local_40);
  cmsys::String::~String(&local_60);
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }